

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::CycleDelayControl::fromSyntax
          (Compilation *compilation,DelaySyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  CycleDelayControl *ctrl;
  Scope *scope;
  Symbol *pSVar4;
  SourceRange sourceRange;
  SourceRange local_38;
  
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->delayValue);
  iVar2 = Expression::bind((int)pEVar3,(sockaddr *)context,0);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ctrl = BumpAllocator::
         emplace<slang::ast::CycleDelayControl,slang::ast::Expression_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Expression *)CONCAT44(extraout_var,iVar2),
                    &local_38);
  bVar1 = ASTContext::requireIntegral(context,(Expression *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    if (((context->flags).m_bits & 0x400000) == 0) {
      scope = not_null<const_slang::ast::Scope_*>::get(&context->scope);
      pSVar4 = Compilation::getDefaultClocking(compilation,scope);
      if (pSVar4 == (Symbol *)0x0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(context,(DiagCode)0x280008,sourceRange);
      }
    }
  }
  else {
    ctrl = (CycleDelayControl *)TimingControl::badCtrl(compilation,&ctrl->super_TimingControl);
  }
  return &ctrl->super_TimingControl;
}

Assistant:

TimingControl& CycleDelayControl::fromSyntax(Compilation& compilation, const DelaySyntax& syntax,
                                             const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.delayValue, context);
    auto result = compilation.emplace<CycleDelayControl>(expr, syntax.sourceRange());

    if (!context.requireIntegral(expr))
        return badCtrl(compilation, result);

    if (!context.flags.has(ASTFlags::LValue) && !compilation.getDefaultClocking(*context.scope))
        context.addDiag(diag::NoDefaultClocking, syntax.sourceRange());

    return *result;
}